

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_SEL(DisasContext_conflict1 *s,arg_rrr *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 retval;
  TCGv_i32 arg3;
  TCGv_i32 ret;
  TCGv_i32 t3;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGContext_conflict1 *tcg_ctx;
  arg_rrr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    iVar1 = arm_dc_feature(s,3);
  }
  else {
    iVar1 = arm_dc_feature(s,0x22);
  }
  if (iVar1 != 0) {
    retval = load_reg(s,a->rn);
    arg3 = load_reg(s,a->rm);
    ret = tcg_temp_new_i32(tcg_ctx_00);
    tcg_gen_ld_i32(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,0x21c);
    gen_helper_sel_flags(tcg_ctx_00,retval,ret,retval,arg3);
    tcg_temp_free_i32(tcg_ctx_00,ret);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
    store_reg(s,a->rd,retval);
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_SEL(DisasContext *s, arg_rrr *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t1, t2, t3;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t1 = load_reg(s, a->rn);
    t2 = load_reg(s, a->rm);
    t3 = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx, t3, tcg_ctx->cpu_env, offsetof(CPUARMState, GE));
    gen_helper_sel_flags(tcg_ctx, t1, t3, t1, t2);
    tcg_temp_free_i32(tcg_ctx, t3);
    tcg_temp_free_i32(tcg_ctx, t2);
    store_reg(s, a->rd, t1);
    return true;
}